

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineRenderToImageTests.cpp
# Opt level: O1

vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_> *
vkt::pipeline::anon_unknown_0::genFullQuadVertices
          (vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
           *__return_storage_ptr__,int subpassCount)

{
  uint uVar1;
  value_type local_50;
  
  (__return_storage_ptr__->
  super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (0 < subpassCount) {
    uVar1 = 0;
    do {
      local_50.position.m_data[0] = 0.0;
      local_50.position.m_data[1] = -1.0;
      local_50.position.m_data[2] = 0.0;
      local_50.position.m_data[3] = 1.0;
      local_50.color.m_data._0_8_ =
           *(undefined8 *)
            ((long)&pipeline::(anonymous_namespace)::COLOR_TABLE + (ulong)(uVar1 & 0x70));
      local_50.color.m_data._8_8_ = *(undefined8 *)(&UNK_00ae7528 + (uVar1 & 0x70));
      std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::
      push_back(__return_storage_ptr__,&local_50);
      local_50.position.m_data[0] = 0.0;
      local_50.position.m_data[1] = 1.0;
      local_50.position.m_data[2] = 0.0;
      local_50.position.m_data[3] = 1.0;
      std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::
      push_back(__return_storage_ptr__,&local_50);
      local_50.position.m_data[0] = 1.0;
      local_50.position.m_data[1] = -1.0;
      local_50.position.m_data[2] = 0.0;
      local_50.position.m_data[3] = 1.0;
      std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::
      push_back(__return_storage_ptr__,&local_50);
      local_50.position.m_data[0] = 1.0;
      local_50.position.m_data[1] = 1.0;
      local_50.position.m_data[2] = 0.0;
      local_50.position.m_data[3] = 1.0;
      std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::
      push_back(__return_storage_ptr__,&local_50);
      uVar1 = uVar1 + 0x10;
      subpassCount = subpassCount + -1;
    } while (subpassCount != 0);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<Vertex4RGBA> genFullQuadVertices (const int subpassCount)
{
	vector<Vertex4RGBA>	vectorData;
	for (int subpassNdx = 0; subpassNdx < subpassCount; ++subpassNdx)
	{
		Vertex4RGBA data =
		{
			Vec4(0.0f, -1.0f, 0.0f, 1.0f),
			COLOR_TABLE[subpassNdx % DE_LENGTH_OF_ARRAY(COLOR_TABLE)],
		};
		vectorData.push_back(data);
		data.position	= Vec4(0.0f,  1.0f, 0.0f, 1.0f);
		vectorData.push_back(data);
		data.position	= Vec4(1.0f, -1.0f, 0.0f, 1.0f);
		vectorData.push_back(data);
		data.position	= Vec4(1.0f,  1.0f, 0.0f, 1.0f);
		vectorData.push_back(data);
	}
	return vectorData;
}